

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc_shutdown.c
# Opt level: O0

int main(void)

{
  int sock;
  nn_thread threads [100];
  int j;
  int i;
  int sb;
  
  sock = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc_shutdown.c"
                          ,0x3a,1,0x20);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc_shutdown.c"
                 ,0x3b,sock,"inproc://test");
  for (threads[99].handle._0_4_ = 0; (int)threads[99].handle != 10;
      threads[99].handle._0_4_ = (int)threads[99].handle + 1) {
    for (threads[99].handle._4_4_ = 0; threads[99].handle._4_4_ != 100;
        threads[99].handle._4_4_ = threads[99].handle._4_4_ + 1) {
      nn_thread_init((nn_thread *)&threads[(long)threads[99].handle._4_4_ + -1].handle,routine,
                     (void *)0x0);
    }
    for (threads[99].handle._4_4_ = 0; threads[99].handle._4_4_ != 100;
        threads[99].handle._4_4_ = threads[99].handle._4_4_ + 1) {
      nn_thread_term((nn_thread *)&threads[(long)threads[99].handle._4_4_ + -1].handle);
    }
  }
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc_shutdown.c"
                  ,0x44,sock);
  return 0;
}

Assistant:

int main ()
{
    int sb;
    int i;
    int j;
    struct nn_thread threads [THREAD_COUNT];

    /*  Stress the shutdown algorithm. */

    sb = test_socket (AF_SP, NN_PUB);
    test_bind (sb, SOCKET_ADDRESS);

    for (j = 0; j != 10; ++j) {
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_init (&threads [i], routine, NULL);
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_term (&threads [i]);
    }

    test_close (sb);

    return 0;
}